

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O1

void bench_sign_run(void *arg,int iters)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  undefined1 auVar22 [16];
  int iVar23;
  long lVar24;
  long lVar25;
  char cVar26;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar37;
  char cVar38;
  char cVar39;
  char cVar40;
  char cVar41;
  char cVar42;
  undefined1 auVar27 [16];
  char cVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  short sVar51;
  short sVar52;
  undefined1 auVar60 [16];
  short sVar61;
  short sVar62;
  undefined1 auVar67 [12];
  undefined1 auVar72 [16];
  undefined4 uVar74;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  size_t siglen;
  uchar sig [74];
  secp256k1_ecdsa_signature signature;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_70 [64];
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  long lVar36;
  undefined4 uVar53;
  undefined6 uVar54;
  undefined8 uVar55;
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [14];
  undefined1 auVar59 [14];
  undefined4 uVar63;
  undefined6 uVar64;
  undefined8 uVar65;
  undefined1 auVar66 [12];
  undefined1 auVar68 [12];
  undefined1 auVar69 [14];
  undefined1 auVar70 [14];
  undefined1 auVar71 [14];
  undefined1 auVar73 [16];
  undefined6 uVar75;
  undefined8 uVar76;
  undefined1 auVar77 [12];
  undefined1 auVar78 [14];
  undefined1 auVar81 [16];
  
  if (0 < iters) {
    do {
      local_d0 = 0x4a;
      lVar25 = *arg;
      iVar23 = secp256k1_ecdsa_sign
                         (lVar25,local_70,(undefined8 *)((long)arg + 8),
                          (undefined8 *)((long)arg + 0x28),0,0);
      if (iVar23 == 0) {
        bench_sign_run_cold_2();
LAB_00103d97:
        bench_sign_run_cold_1();
        auVar22 = _DAT_00105090;
        lVar24 = 0;
        auVar27 = _DAT_00105010;
        auVar44 = _DAT_00105020;
        auVar45 = _DAT_00105030;
        auVar46 = _DAT_00105040;
        auVar47 = _DAT_00105050;
        auVar48 = _DAT_00105060;
        auVar49 = _DAT_00105070;
        auVar50 = _DAT_00105080;
        do {
          auVar60 = auVar50 & auVar22;
          auVar72 = auVar49 & auVar22;
          sVar10 = auVar60._0_2_;
          cVar34 = (0 < sVar10) * (sVar10 < 0x100) * auVar60[0] - (0xff < sVar10);
          sVar10 = auVar60._2_2_;
          sVar51 = CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar60[2] - (0xff < sVar10),cVar34);
          sVar10 = auVar60._4_2_;
          cVar26 = (0 < sVar10) * (sVar10 < 0x100) * auVar60[4] - (0xff < sVar10);
          sVar10 = auVar60._6_2_;
          uVar53 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar60[6] - (0xff < sVar10),
                            CONCAT12(cVar26,sVar51));
          sVar10 = auVar60._8_2_;
          cVar28 = (0 < sVar10) * (sVar10 < 0x100) * auVar60[8] - (0xff < sVar10);
          sVar10 = auVar60._10_2_;
          uVar54 = CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar60[10] - (0xff < sVar10),
                            CONCAT14(cVar28,uVar53));
          sVar10 = auVar60._12_2_;
          cVar29 = (0 < sVar10) * (sVar10 < 0x100) * auVar60[0xc] - (0xff < sVar10);
          sVar10 = auVar60._14_2_;
          uVar55 = CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar60[0xe] - (0xff < sVar10),
                            CONCAT16(cVar29,uVar54));
          sVar10 = auVar72._0_2_;
          cVar30 = (0 < sVar10) * (sVar10 < 0x100) * auVar72[0] - (0xff < sVar10);
          sVar10 = auVar72._2_2_;
          auVar56._0_10_ =
               CONCAT19((0 < sVar10) * (sVar10 < 0x100) * auVar72[2] - (0xff < sVar10),
                        CONCAT18(cVar30,uVar55));
          sVar10 = auVar72._4_2_;
          cVar31 = (0 < sVar10) * (sVar10 < 0x100) * auVar72[4] - (0xff < sVar10);
          auVar56[10] = cVar31;
          sVar10 = auVar72._6_2_;
          auVar56[0xb] = (0 < sVar10) * (sVar10 < 0x100) * auVar72[6] - (0xff < sVar10);
          sVar10 = auVar72._8_2_;
          cVar32 = (0 < sVar10) * (sVar10 < 0x100) * auVar72[8] - (0xff < sVar10);
          auVar58[0xc] = cVar32;
          auVar58._0_12_ = auVar56;
          sVar10 = auVar72._10_2_;
          auVar58[0xd] = (0 < sVar10) * (sVar10 < 0x100) * auVar72[10] - (0xff < sVar10);
          sVar10 = auVar72._12_2_;
          cVar33 = (0 < sVar10) * (sVar10 < 0x100) * auVar72[0xc] - (0xff < sVar10);
          auVar60[0xe] = cVar33;
          auVar60._0_14_ = auVar58;
          sVar10 = auVar72._14_2_;
          auVar60[0xf] = (0 < sVar10) * (sVar10 < 0x100) * auVar72[0xe] - (0xff < sVar10);
          auVar72 = auVar48 & auVar22;
          auVar79 = auVar47 & auVar22;
          sVar10 = auVar72._0_2_;
          cVar43 = (0 < sVar10) * (sVar10 < 0x100) * auVar72[0] - (0xff < sVar10);
          sVar10 = auVar72._2_2_;
          sVar61 = CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar72[2] - (0xff < sVar10),cVar43);
          sVar10 = auVar72._4_2_;
          cVar42 = (0 < sVar10) * (sVar10 < 0x100) * auVar72[4] - (0xff < sVar10);
          sVar10 = auVar72._6_2_;
          uVar63 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar72[6] - (0xff < sVar10),
                            CONCAT12(cVar42,sVar61));
          sVar10 = auVar72._8_2_;
          cVar35 = (0 < sVar10) * (sVar10 < 0x100) * auVar72[8] - (0xff < sVar10);
          sVar10 = auVar72._10_2_;
          uVar64 = CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar72[10] - (0xff < sVar10),
                            CONCAT14(cVar35,uVar63));
          sVar10 = auVar72._12_2_;
          cVar41 = (0 < sVar10) * (sVar10 < 0x100) * auVar72[0xc] - (0xff < sVar10);
          sVar10 = auVar72._14_2_;
          uVar65 = CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar72[0xe] - (0xff < sVar10),
                            CONCAT16(cVar41,uVar64));
          sVar10 = auVar79._0_2_;
          cVar40 = (0 < sVar10) * (sVar10 < 0x100) * auVar79[0] - (0xff < sVar10);
          sVar10 = auVar79._2_2_;
          auVar66._0_10_ =
               CONCAT19((0 < sVar10) * (sVar10 < 0x100) * auVar79[2] - (0xff < sVar10),
                        CONCAT18(cVar40,uVar65));
          sVar10 = auVar79._4_2_;
          cVar39 = (0 < sVar10) * (sVar10 < 0x100) * auVar79[4] - (0xff < sVar10);
          auVar66[10] = cVar39;
          sVar10 = auVar79._6_2_;
          auVar66[0xb] = (0 < sVar10) * (sVar10 < 0x100) * auVar79[6] - (0xff < sVar10);
          sVar10 = auVar79._8_2_;
          cVar38 = (0 < sVar10) * (sVar10 < 0x100) * auVar79[8] - (0xff < sVar10);
          auVar69[0xc] = cVar38;
          auVar69._0_12_ = auVar66;
          sVar10 = auVar79._10_2_;
          auVar69[0xd] = (0 < sVar10) * (sVar10 < 0x100) * auVar79[10] - (0xff < sVar10);
          sVar10 = auVar79._12_2_;
          cVar37 = (0 < sVar10) * (sVar10 < 0x100) * auVar79[0xc] - (0xff < sVar10);
          auVar80[0xe] = cVar37;
          auVar80._0_14_ = auVar69;
          sVar10 = auVar79._14_2_;
          auVar80[0xf] = (0 < sVar10) * (sVar10 < 0x100) * auVar79[0xe] - (0xff < sVar10);
          cVar2 = (0 < sVar51) * (sVar51 < 0x100) * cVar34 - (0xff < sVar51);
          sVar10 = (short)((uint)uVar53 >> 0x10);
          sVar52 = CONCAT11((0 < sVar10) * (sVar10 < 0x100) * cVar26 - (0xff < sVar10),cVar2);
          sVar10 = (short)((uint6)uVar54 >> 0x20);
          cVar34 = (0 < sVar10) * (sVar10 < 0x100) * cVar28 - (0xff < sVar10);
          sVar10 = (short)((ulong)uVar55 >> 0x30);
          uVar53 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * cVar29 - (0xff < sVar10),
                            CONCAT12(cVar34,sVar52));
          sVar10 = (short)((unkuint10)auVar56._0_10_ >> 0x40);
          cVar26 = (0 < sVar10) * (sVar10 < 0x100) * cVar30 - (0xff < sVar10);
          sVar10 = auVar56._10_2_;
          uVar54 = CONCAT15((0 < sVar10) * (sVar10 < 0x100) * cVar31 - (0xff < sVar10),
                            CONCAT14(cVar26,uVar53));
          sVar10 = auVar58._12_2_;
          cVar32 = (0 < sVar10) * (sVar10 < 0x100) * cVar32 - (0xff < sVar10);
          sVar10 = auVar60._14_2_;
          uVar55 = CONCAT17((0 < sVar10) * (sVar10 < 0x100) * cVar33 - (0xff < sVar10),
                            CONCAT16(cVar32,uVar54));
          cVar31 = (0 < sVar61) * (sVar61 < 0x100) * cVar43 - (0xff < sVar61);
          sVar10 = (short)((uint)uVar63 >> 0x10);
          auVar57._0_10_ =
               CONCAT19((0 < sVar10) * (sVar10 < 0x100) * cVar42 - (0xff < sVar10),
                        CONCAT18(cVar31,uVar55));
          sVar10 = (short)((uint6)uVar64 >> 0x20);
          cVar30 = (0 < sVar10) * (sVar10 < 0x100) * cVar35 - (0xff < sVar10);
          auVar57[10] = cVar30;
          sVar10 = (short)((ulong)uVar65 >> 0x30);
          auVar57[0xb] = (0 < sVar10) * (sVar10 < 0x100) * cVar41 - (0xff < sVar10);
          sVar10 = (short)((unkuint10)auVar66._0_10_ >> 0x40);
          cVar29 = (0 < sVar10) * (sVar10 < 0x100) * cVar40 - (0xff < sVar10);
          auVar59[0xc] = cVar29;
          auVar59._0_12_ = auVar57;
          sVar10 = auVar66._10_2_;
          auVar59[0xd] = (0 < sVar10) * (sVar10 < 0x100) * cVar39 - (0xff < sVar10);
          sVar10 = auVar69._12_2_;
          cVar28 = (0 < sVar10) * (sVar10 < 0x100) * cVar38 - (0xff < sVar10);
          auVar72[0xe] = cVar28;
          auVar72._0_14_ = auVar59;
          sVar10 = auVar80._14_2_;
          auVar72[0xf] = (0 < sVar10) * (sVar10 < 0x100) * cVar37 - (0xff < sVar10);
          auVar60 = auVar46 & auVar22;
          auVar80 = auVar45 & auVar22;
          sVar10 = auVar60._0_2_;
          cVar33 = (0 < sVar10) * (sVar10 < 0x100) * auVar60[0] - (0xff < sVar10);
          sVar10 = auVar60._2_2_;
          sVar51 = CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar60[2] - (0xff < sVar10),cVar33);
          sVar10 = auVar60._4_2_;
          cVar35 = (0 < sVar10) * (sVar10 < 0x100) * auVar60[4] - (0xff < sVar10);
          sVar10 = auVar60._6_2_;
          uVar63 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar60[6] - (0xff < sVar10),
                            CONCAT12(cVar35,sVar51));
          sVar10 = auVar60._8_2_;
          cVar37 = (0 < sVar10) * (sVar10 < 0x100) * auVar60[8] - (0xff < sVar10);
          sVar10 = auVar60._10_2_;
          uVar64 = CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar60[10] - (0xff < sVar10),
                            CONCAT14(cVar37,uVar63));
          sVar10 = auVar60._12_2_;
          cVar38 = (0 < sVar10) * (sVar10 < 0x100) * auVar60[0xc] - (0xff < sVar10);
          sVar10 = auVar60._14_2_;
          uVar65 = CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar60[0xe] - (0xff < sVar10),
                            CONCAT16(cVar38,uVar64));
          sVar10 = auVar80._0_2_;
          cVar39 = (0 < sVar10) * (sVar10 < 0x100) * auVar80[0] - (0xff < sVar10);
          sVar10 = auVar80._2_2_;
          auVar67._0_10_ =
               CONCAT19((0 < sVar10) * (sVar10 < 0x100) * auVar80[2] - (0xff < sVar10),
                        CONCAT18(cVar39,uVar65));
          sVar10 = auVar80._4_2_;
          cVar40 = (0 < sVar10) * (sVar10 < 0x100) * auVar80[4] - (0xff < sVar10);
          auVar67[10] = cVar40;
          sVar10 = auVar80._6_2_;
          auVar67[0xb] = (0 < sVar10) * (sVar10 < 0x100) * auVar80[6] - (0xff < sVar10);
          sVar10 = auVar80._8_2_;
          cVar41 = (0 < sVar10) * (sVar10 < 0x100) * auVar80[8] - (0xff < sVar10);
          auVar70[0xc] = cVar41;
          auVar70._0_12_ = auVar67;
          sVar10 = auVar80._10_2_;
          auVar70[0xd] = (0 < sVar10) * (sVar10 < 0x100) * auVar80[10] - (0xff < sVar10);
          sVar10 = auVar80._12_2_;
          cVar42 = (0 < sVar10) * (sVar10 < 0x100) * auVar80[0xc] - (0xff < sVar10);
          auVar79[0xe] = cVar42;
          auVar79._0_14_ = auVar70;
          sVar10 = auVar80._14_2_;
          auVar79[0xf] = (0 < sVar10) * (sVar10 < 0x100) * auVar80[0xe] - (0xff < sVar10);
          auVar60 = auVar44 & auVar22;
          auVar80 = auVar27 & auVar22;
          sVar10 = auVar60._0_2_;
          cVar43 = (0 < sVar10) * (sVar10 < 0x100) * auVar60[0] - (0xff < sVar10);
          sVar10 = auVar60._2_2_;
          sVar61 = CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar60[2] - (0xff < sVar10),cVar43);
          sVar10 = auVar60._4_2_;
          cVar3 = (0 < sVar10) * (sVar10 < 0x100) * auVar60[4] - (0xff < sVar10);
          sVar10 = auVar60._6_2_;
          uVar74 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar60[6] - (0xff < sVar10),
                            CONCAT12(cVar3,sVar61));
          sVar10 = auVar60._8_2_;
          cVar4 = (0 < sVar10) * (sVar10 < 0x100) * auVar60[8] - (0xff < sVar10);
          sVar10 = auVar60._10_2_;
          uVar75 = CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar60[10] - (0xff < sVar10),
                            CONCAT14(cVar4,uVar74));
          sVar10 = auVar60._12_2_;
          cVar5 = (0 < sVar10) * (sVar10 < 0x100) * auVar60[0xc] - (0xff < sVar10);
          sVar10 = auVar60._14_2_;
          uVar76 = CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar60[0xe] - (0xff < sVar10),
                            CONCAT16(cVar5,uVar75));
          sVar10 = auVar80._0_2_;
          cVar6 = (0 < sVar10) * (sVar10 < 0x100) * auVar80[0] - (0xff < sVar10);
          sVar10 = auVar80._2_2_;
          auVar77._0_10_ =
               CONCAT19((0 < sVar10) * (sVar10 < 0x100) * auVar80[2] - (0xff < sVar10),
                        CONCAT18(cVar6,uVar76));
          sVar10 = auVar80._4_2_;
          cVar7 = (0 < sVar10) * (sVar10 < 0x100) * auVar80[4] - (0xff < sVar10);
          auVar77[10] = cVar7;
          sVar10 = auVar80._6_2_;
          auVar77[0xb] = (0 < sVar10) * (sVar10 < 0x100) * auVar80[6] - (0xff < sVar10);
          sVar10 = auVar80._8_2_;
          cVar8 = (0 < sVar10) * (sVar10 < 0x100) * auVar80[8] - (0xff < sVar10);
          auVar78[0xc] = cVar8;
          auVar78._0_12_ = auVar77;
          sVar10 = auVar80._10_2_;
          auVar78[0xd] = (0 < sVar10) * (sVar10 < 0x100) * auVar80[10] - (0xff < sVar10);
          sVar10 = auVar80._12_2_;
          cVar9 = (0 < sVar10) * (sVar10 < 0x100) * auVar80[0xc] - (0xff < sVar10);
          auVar81[0xe] = cVar9;
          auVar81._0_14_ = auVar78;
          sVar10 = auVar80._14_2_;
          auVar81[0xf] = (0 < sVar10) * (sVar10 < 0x100) * auVar80[0xe] - (0xff < sVar10);
          cVar33 = (0 < sVar51) * (sVar51 < 0x100) * cVar33 - (0xff < sVar51);
          sVar10 = (short)((uint)uVar63 >> 0x10);
          sVar62 = CONCAT11((0 < sVar10) * (sVar10 < 0x100) * cVar35 - (0xff < sVar10),cVar33);
          sVar10 = (short)((uint6)uVar64 >> 0x20);
          cVar35 = (0 < sVar10) * (sVar10 < 0x100) * cVar37 - (0xff < sVar10);
          sVar10 = (short)((ulong)uVar65 >> 0x30);
          uVar63 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * cVar38 - (0xff < sVar10),
                            CONCAT12(cVar35,sVar62));
          sVar10 = (short)((unkuint10)auVar67._0_10_ >> 0x40);
          cVar37 = (0 < sVar10) * (sVar10 < 0x100) * cVar39 - (0xff < sVar10);
          sVar10 = auVar67._10_2_;
          uVar64 = CONCAT15((0 < sVar10) * (sVar10 < 0x100) * cVar40 - (0xff < sVar10),
                            CONCAT14(cVar37,uVar63));
          sVar10 = auVar70._12_2_;
          cVar38 = (0 < sVar10) * (sVar10 < 0x100) * cVar41 - (0xff < sVar10);
          sVar10 = auVar79._14_2_;
          uVar65 = CONCAT17((0 < sVar10) * (sVar10 < 0x100) * cVar42 - (0xff < sVar10),
                            CONCAT16(cVar38,uVar64));
          cVar39 = (0 < sVar61) * (sVar61 < 0x100) * cVar43 - (0xff < sVar61);
          sVar10 = (short)((uint)uVar74 >> 0x10);
          auVar68._0_10_ =
               CONCAT19((0 < sVar10) * (sVar10 < 0x100) * cVar3 - (0xff < sVar10),
                        CONCAT18(cVar39,uVar65));
          sVar10 = (short)((uint6)uVar75 >> 0x20);
          cVar40 = (0 < sVar10) * (sVar10 < 0x100) * cVar4 - (0xff < sVar10);
          auVar68[10] = cVar40;
          sVar10 = (short)((ulong)uVar76 >> 0x30);
          auVar68[0xb] = (0 < sVar10) * (sVar10 < 0x100) * cVar5 - (0xff < sVar10);
          sVar10 = (short)((unkuint10)auVar77._0_10_ >> 0x40);
          cVar41 = (0 < sVar10) * (sVar10 < 0x100) * cVar6 - (0xff < sVar10);
          auVar71[0xc] = cVar41;
          auVar71._0_12_ = auVar68;
          sVar10 = auVar77._10_2_;
          auVar71[0xd] = (0 < sVar10) * (sVar10 < 0x100) * cVar7 - (0xff < sVar10);
          sVar10 = auVar78._12_2_;
          cVar42 = (0 < sVar10) * (sVar10 < 0x100) * cVar8 - (0xff < sVar10);
          auVar73[0xe] = cVar42;
          auVar73._0_14_ = auVar71;
          sVar10 = auVar81._14_2_;
          auVar73[0xf] = (0 < sVar10) * (sVar10 < 0x100) * cVar9 - (0xff < sVar10);
          sVar10 = (short)((uint)uVar53 >> 0x10);
          sVar51 = (short)((uint6)uVar54 >> 0x20);
          sVar61 = (short)((ulong)uVar55 >> 0x30);
          sVar11 = (short)((unkuint10)auVar57._0_10_ >> 0x40);
          sVar12 = auVar57._10_2_;
          sVar13 = auVar59._12_2_;
          sVar14 = auVar72._14_2_;
          sVar15 = (short)((uint)uVar63 >> 0x10);
          sVar16 = (short)((uint6)uVar64 >> 0x20);
          sVar17 = (short)((ulong)uVar65 >> 0x30);
          sVar18 = (short)((unkuint10)auVar68._0_10_ >> 0x40);
          sVar19 = auVar68._10_2_;
          sVar20 = auVar71._12_2_;
          sVar21 = auVar73._14_2_;
          pcVar1 = (char *)(lVar25 + 8 + lVar24);
          *pcVar1 = ((0 < sVar52) * (sVar52 < 0x100) * cVar2 - (0xff < sVar52)) + '\x01';
          pcVar1[1] = ((0 < sVar10) * (sVar10 < 0x100) * cVar34 - (0xff < sVar10)) + '\x01';
          pcVar1[2] = ((0 < sVar51) * (sVar51 < 0x100) * cVar26 - (0xff < sVar51)) + '\x01';
          pcVar1[3] = ((0 < sVar61) * (sVar61 < 0x100) * cVar32 - (0xff < sVar61)) + '\x01';
          pcVar1[4] = ((0 < sVar11) * (sVar11 < 0x100) * cVar31 - (0xff < sVar11)) + '\x01';
          pcVar1[5] = ((0 < sVar12) * (sVar12 < 0x100) * cVar30 - (0xff < sVar12)) + '\x01';
          pcVar1[6] = ((0 < sVar13) * (sVar13 < 0x100) * cVar29 - (0xff < sVar13)) + '\x01';
          pcVar1[7] = ((0 < sVar14) * (sVar14 < 0x100) * cVar28 - (0xff < sVar14)) + '\x01';
          pcVar1[8] = ((0 < sVar62) * (sVar62 < 0x100) * cVar33 - (0xff < sVar62)) + '\x01';
          pcVar1[9] = ((0 < sVar15) * (sVar15 < 0x100) * cVar35 - (0xff < sVar15)) + '\x01';
          pcVar1[10] = ((0 < sVar16) * (sVar16 < 0x100) * cVar37 - (0xff < sVar16)) + '\x01';
          pcVar1[0xb] = ((0 < sVar17) * (sVar17 < 0x100) * cVar38 - (0xff < sVar17)) + '\x01';
          pcVar1[0xc] = ((0 < sVar18) * (sVar18 < 0x100) * cVar39 - (0xff < sVar18)) + '\x01';
          pcVar1[0xd] = ((0 < sVar19) * (sVar19 < 0x100) * cVar40 - (0xff < sVar19)) + '\x01';
          pcVar1[0xe] = ((0 < sVar20) * (sVar20 < 0x100) * cVar41 - (0xff < sVar20)) + '\x01';
          pcVar1[0xf] = ((0 < sVar21) * (sVar21 < 0x100) * cVar42 - (0xff < sVar21)) + '\x01';
          lVar24 = lVar24 + 0x10;
          lVar36 = auVar50._8_8_;
          auVar50._0_8_ = auVar50._0_8_ + 0x10;
          auVar50._8_8_ = lVar36 + 0x10;
          lVar36 = auVar49._8_8_;
          auVar49._0_8_ = auVar49._0_8_ + 0x10;
          auVar49._8_8_ = lVar36 + 0x10;
          lVar36 = auVar48._8_8_;
          auVar48._0_8_ = auVar48._0_8_ + 0x10;
          auVar48._8_8_ = lVar36 + 0x10;
          lVar36 = auVar47._8_8_;
          auVar47._0_8_ = auVar47._0_8_ + 0x10;
          auVar47._8_8_ = lVar36 + 0x10;
          lVar36 = auVar46._8_8_;
          auVar46._0_8_ = auVar46._0_8_ + 0x10;
          auVar46._8_8_ = lVar36 + 0x10;
          lVar36 = auVar45._8_8_;
          auVar45._0_8_ = auVar45._0_8_ + 0x10;
          auVar45._8_8_ = lVar36 + 0x10;
          lVar36 = auVar44._8_8_;
          auVar44._0_8_ = auVar44._0_8_ + 0x10;
          auVar44._8_8_ = lVar36 + 0x10;
          lVar36 = auVar27._8_8_;
          auVar27._0_8_ = auVar27._0_8_ + 0x10;
          auVar27._8_8_ = lVar36 + 0x10;
        } while (lVar24 != 0x20);
        cVar26 = '\0';
        cVar28 = '\x01';
        cVar29 = '\x02';
        cVar30 = '\x03';
        cVar31 = '\x04';
        cVar32 = '\x05';
        cVar33 = '\x06';
        cVar34 = '\a';
        cVar35 = '\b';
        cVar37 = '\t';
        cVar38 = '\n';
        cVar39 = '\v';
        cVar40 = '\f';
        cVar41 = '\r';
        cVar42 = '\x0e';
        cVar43 = '\x0f';
        lVar24 = 0;
        do {
          pcVar1 = (char *)(lVar25 + 0x28 + lVar24);
          *pcVar1 = cVar26 + 'A';
          pcVar1[1] = cVar28 + 'A';
          pcVar1[2] = cVar29 + 'A';
          pcVar1[3] = cVar30 + 'A';
          pcVar1[4] = cVar31 + 'A';
          pcVar1[5] = cVar32 + 'A';
          pcVar1[6] = cVar33 + 'A';
          pcVar1[7] = cVar34 + 'A';
          pcVar1[8] = cVar35 + 'A';
          pcVar1[9] = cVar37 + 'A';
          pcVar1[10] = cVar38 + 'A';
          pcVar1[0xb] = cVar39 + 'A';
          pcVar1[0xc] = cVar40 + 'A';
          pcVar1[0xd] = cVar41 + 'A';
          pcVar1[0xe] = cVar42 + 'A';
          pcVar1[0xf] = cVar43 + 'A';
          lVar24 = lVar24 + 0x10;
          cVar26 = cVar26 + '\x10';
          cVar28 = cVar28 + '\x10';
          cVar29 = cVar29 + '\x10';
          cVar30 = cVar30 + '\x10';
          cVar31 = cVar31 + '\x10';
          cVar32 = cVar32 + '\x10';
          cVar33 = cVar33 + '\x10';
          cVar34 = cVar34 + '\x10';
          cVar35 = cVar35 + '\x10';
          cVar37 = cVar37 + '\x10';
          cVar38 = cVar38 + '\x10';
          cVar39 = cVar39 + '\x10';
          cVar40 = cVar40 + '\x10';
          cVar41 = cVar41 + '\x10';
          cVar42 = cVar42 + '\x10';
          cVar43 = cVar43 + '\x10';
        } while (lVar24 != 0x20);
        return;
      }
      lVar25 = *arg;
      iVar23 = secp256k1_ecdsa_signature_serialize_der(lVar25,&local_c8,&local_d0,local_70);
      if (iVar23 == 0) goto LAB_00103d97;
      *(undefined8 *)((long)arg + 0x18) = local_b8;
      *(undefined8 *)((long)arg + 0x20) = uStack_b0;
      *(undefined8 *)((long)arg + 8) = local_c8;
      *(undefined8 *)((long)arg + 0x10) = uStack_c0;
      *(undefined8 *)((long)arg + 0x38) = local_98;
      *(undefined8 *)((long)arg + 0x40) = uStack_90;
      *(undefined8 *)((long)arg + 0x28) = local_a8;
      *(undefined8 *)((long)arg + 0x30) = uStack_a0;
      iters = iters + -1;
    } while (iters != 0);
  }
  return;
}

Assistant:

static void bench_sign_run(void* arg, int iters) {
    int i;
    bench_data *data = (bench_data*)arg;

    unsigned char sig[74];
    for (i = 0; i < iters; i++) {
        size_t siglen = 74;
        int j;
        secp256k1_ecdsa_signature signature;
        CHECK(secp256k1_ecdsa_sign(data->ctx, &signature, data->msg, data->key, NULL, NULL));
        CHECK(secp256k1_ecdsa_signature_serialize_der(data->ctx, sig, &siglen, &signature));
        for (j = 0; j < 32; j++) {
            data->msg[j] = sig[j];
            data->key[j] = sig[j + 32];
        }
    }
}